

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O0

void __thiscall spdlog::async_logger::flush_(async_logger *this)

{
  bool bVar1;
  exception *ex;
  shared_ptr<spdlog::details::thread_pool> pool_ptr;
  enable_shared_from_this<spdlog::async_logger> *in_stack_ffffffffffffff18;
  weak_ptr<spdlog::details::thread_pool> *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  __shared_ptr local_18 [24];
  
  std::weak_ptr<spdlog::details::thread_pool>::lock(in_stack_ffffffffffffff28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    throw_spdlog_ex(in_stack_ffffffffffffff60);
  }
  std::__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x6e4023);
  std::enable_shared_from_this<spdlog::async_logger>::shared_from_this(in_stack_ffffffffffffff18);
  details::thread_pool::post_flush
            ((thread_pool *)this,
             (async_logger_ptr *)
             pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             pool_ptr.super___shared_ptr<spdlog::details::thread_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._4_4_);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x6e406f);
  std::shared_ptr<spdlog::details::thread_pool>::~shared_ptr
            ((shared_ptr<spdlog::details::thread_pool> *)0x6e4142);
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::flush_(){
    SPDLOG_TRY{if (auto pool_ptr = thread_pool_.lock()){
        pool_ptr->post_flush(shared_from_this(), overflow_policy_);
}
else {
    throw_spdlog_ex("async flush: thread pool doesn't exist anymore");
}
}
SPDLOG_LOGGER_CATCH(source_loc())
}